

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::default_cost_type<long_double>::make_l1_norm
          (default_cost_type<long_double> *this,int n)

{
  bool bVar1;
  type plVar2;
  unique_ptr<long_double[],_std::default_delete<long_double[]>_> *this_00;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  int local_30;
  int local_2c;
  int i_1;
  int i;
  longdouble div;
  int n_local;
  default_cost_type<long_double> *this_local;
  
  _i_1 = (longdouble)0;
  for (local_2c = 0; local_2c != n; local_2c = local_2c + 1) {
    this_00 = &this->linear_elements;
    std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
              (this_00,(long)local_2c);
    std::abs((int)this_00);
    _i_1 = _i_1 + in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
  }
  bVar1 = std::isnormal(_i_1);
  if (bVar1) {
    for (local_30 = 0; local_30 != n; local_30 = local_30 + 1) {
      plVar2 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->linear_elements,(long)local_30);
      *plVar2 = *plVar2 / _i_1;
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }